

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O3

D_Sym * update_D_Sym(D_Sym *sym,D_Scope **pst,int sizeof_D_Sym)

{
  D_Scope *pDVar1;
  D_Scope *pDVar2;
  D_Scope *st;
  D_Sym *pDVar3;
  
  pDVar1 = *pst;
  st = (D_Scope *)calloc(1,0x50);
  pDVar2 = pDVar1->up;
  st->depth = pDVar1->depth;
  st->up = pDVar2;
  *(byte *)st = *(byte *)pDVar1 & 3;
  st->search = pDVar1;
  st->up_updates = pDVar1;
  st->down_next = pDVar1->down;
  pDVar1->down = st;
  *pst = st;
  pDVar3 = update_additional_D_Sym(st,sym,sizeof_D_Sym);
  return pDVar3;
}

Assistant:

D_Sym *update_D_Sym(D_Sym *sym, D_Scope **pst, int sizeof_D_Sym) {
  *pst = enter_D_Scope(*pst, *pst);
  return update_additional_D_Sym(*pst, sym, sizeof_D_Sym);
}